

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

numeric * __thiscall
cs_impl::
cni_helper<cs::numeric(*)(cs::numeric_const&,cs::numeric_const&),cs::numeric(*)(cs::numeric_const&,cs::numeric_const&)>
::_call<0,1>(cni_helper<cs::numeric_(*)(const_cs::numeric_&,_const_cs::numeric_&),_cs::numeric_(*)(const_cs::numeric_&,_const_cs::numeric_&)>
             *this,vector *args,sequence<0,_1> *param_3)

{
  numeric *rhs;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  numeric *in_RDI;
  var *in_stack_000000b0;
  var *in_stack_000000c0;
  numeric *__args;
  undefined8 in_stack_ffffffffffffffb8;
  
  __args = in_RDI;
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RDX,0);
  try_convert_and_check<const_cs::numeric_&,_const_cs::numeric_&,_cs::numeric,_0UL>::convert
            (in_stack_000000b0);
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RDX,1);
  try_convert_and_check<const_cs::numeric_&,_const_cs::numeric_&,_cs::numeric,_1UL>::convert
            (in_stack_000000c0);
  std::function<cs::numeric_(const_cs::numeric_&,_const_cs::numeric_&)>::operator()
            ((function<cs::numeric_(const_cs::numeric_&,_const_cs::numeric_&)> *)
             in_stack_ffffffffffffffb8,__args,in_RDI);
  rhs = type_convertor<cs::numeric,_cs::numeric>::convert<cs::numeric>
                  ((numeric *)&stack0xffffffffffffffb8);
  cs::numeric::numeric(in_RDI,rhs);
  return __args;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}